

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc.hpp
# Opt level: O3

void * __thiscall cppjit::builder::gcc::compile_impl(gcc *this)

{
  string *__rhs;
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  cppjit_exception *pcVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string link_cmd;
  string compile_cmd;
  string object_file;
  string library_file;
  string source_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  ofstream kernel_header_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  long *local_3e0;
  long local_3d8;
  long local_3d0;
  long lStack_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  long *local_360;
  long local_358;
  long local_350;
  long lStack_348;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290 [2];
  long local_280 [2];
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  __rhs = &(this->super_builder).kernel_name;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                 &(this->super_builder).source_dir,__rhs);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_230);
  local_2b0 = &local_2a0;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_2a0 = *plVar9;
    lStack_298 = plVar3[3];
  }
  else {
    local_2a0 = *plVar9;
    local_2b0 = (long *)*plVar3;
  }
  local_2a8 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  local_2d8 = &(this->super_builder).compile_dir;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                 local_2d8,__rhs);
  plVar3 = (long *)std::__cxx11::string::append(local_230);
  local_300 = &local_2f0;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_2f0 = *plVar9;
    lStack_2e8 = plVar3[3];
  }
  else {
    local_2f0 = *plVar9;
    local_300 = (long *)*plVar3;
  }
  local_2f8 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_builder).compile_dir._M_dataplus._M_p;
  local_480 = &local_470;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,pcVar1,pcVar1 + (this->super_builder).compile_dir._M_string_length
            );
  std::__cxx11::string::append((char *)&local_480);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_480,
                              (ulong)(this->super_builder).kernel_name._M_dataplus._M_p);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar10) {
    local_220[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_220[0]._8_8_ = plVar3[3];
    local_230 = (undefined1  [8])local_220;
  }
  else {
    local_220[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar3;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)paVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_230);
  local_2d0 = &local_2c0;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_2c0 = *plVar9;
    lStack_2b8 = plVar3[3];
  }
  else {
    local_2c0 = *plVar9;
    local_2d0 = (long *)*plVar3;
  }
  local_2c8 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  local_2e0 = __rhs;
  if (local_480 != &local_470) {
    operator_delete(local_480,local_470 + 1);
  }
  pcVar1 = (this->compiler)._M_dataplus._M_p;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,pcVar1,pcVar1 + (this->compiler)._M_string_length);
  std::__cxx11::string::append((char *)&local_460);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_300);
  local_440 = &local_430;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_430 = *plVar9;
    lStack_428 = plVar3[3];
  }
  else {
    local_430 = *plVar9;
    local_440 = (long *)*plVar3;
  }
  local_438 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_420 = &local_410;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_410 = *plVar9;
    lStack_408 = plVar3[3];
  }
  else {
    local_410 = *plVar9;
    local_420 = (long *)*plVar3;
  }
  local_418 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_420,(ulong)(this->cpp_flags)._M_dataplus._M_p);
  local_400 = &local_3f0;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_3f0 = *plVar9;
    lStack_3e8 = plVar3[3];
  }
  else {
    local_3f0 = *plVar9;
    local_400 = (long *)*plVar3;
  }
  local_3f8 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_3e0 = &local_3d0;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_3d0 = *plVar9;
    lStack_3c8 = plVar3[3];
  }
  else {
    local_3d0 = *plVar9;
    local_3e0 = (long *)*plVar3;
  }
  local_3d8 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_3e0,(ulong)(this->include_paths)._M_dataplus._M_p);
  local_3c0 = &local_3b0;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_3b0 = *plVar9;
    lStack_3a8 = plVar3[3];
  }
  else {
    local_3b0 = *plVar9;
    local_3c0 = (long *)*plVar3;
  }
  local_3b8 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  local_3a0 = &local_390;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_390 = *plVar9;
    lStack_388 = plVar3[3];
  }
  else {
    local_390 = *plVar9;
    local_3a0 = (long *)*plVar3;
  }
  local_398 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_3a0,
                              (ulong)(this->super_builder).compile_dir._M_dataplus._M_p);
  local_380 = &local_370;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_370 = *plVar9;
    lStack_368 = plVar3[3];
  }
  else {
    local_370 = *plVar9;
    local_380 = (long *)*plVar3;
  }
  local_378 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_360 = &local_350;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_350 = *plVar9;
    lStack_348 = plVar3[3];
  }
  else {
    local_350 = *plVar9;
    local_360 = (long *)*plVar3;
  }
  local_358 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_2b0);
  local_340 = &local_330;
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_330 = *plVar9;
    lStack_328 = plVar3[3];
  }
  else {
    local_330 = *plVar9;
    local_340 = (long *)*plVar3;
  }
  local_338 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_340);
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_310 = *plVar9;
    lStack_308 = plVar3[3];
    local_320 = &local_310;
  }
  else {
    local_310 = *plVar9;
    local_320 = (long *)*plVar3;
  }
  local_318 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  psVar11 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4a0.field_2._M_allocated_capacity = *psVar11;
    local_4a0.field_2._8_8_ = plVar3[3];
  }
  else {
    local_4a0.field_2._M_allocated_capacity = *psVar11;
    local_4a0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_4a0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar11;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4a0,
                              (ulong)(this->super_builder).compile_dir._M_dataplus._M_p);
  paVar10 = &local_4c0.field_2;
  psVar11 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4c0.field_2._M_allocated_capacity = *psVar11;
    local_4c0.field_2._8_8_ = plVar3[3];
    local_4c0._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_4c0.field_2._M_allocated_capacity = *psVar11;
    local_4c0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_4c0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar11;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4c0,
                              (ulong)(this->super_builder).kernel_name._M_dataplus._M_p);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar12) {
    local_220[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_220[0]._8_8_ = plVar3[3];
    local_230 = (undefined1  [8])local_220;
  }
  else {
    local_220[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar3;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)paVar12;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_230);
  plVar9 = plVar3 + 2;
  if ((long *)*plVar3 == plVar9) {
    local_470 = *plVar9;
    lStack_468 = plVar3[3];
    local_480 = &local_470;
  }
  else {
    local_470 = *plVar9;
    local_480 = (long *)*plVar3;
  }
  local_478 = plVar3[1];
  *plVar3 = (long)plVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,local_330 + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,local_350 + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,local_370 + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,local_390 + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440,local_430 + 1);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  if ((this->super_builder).verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"creating per-kernel header",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
  }
  pcVar1 = (this->super_builder).compile_dir._M_dataplus._M_p;
  local_4c0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c0,pcVar1,pcVar1 + (this->super_builder).compile_dir._M_string_length
            );
  std::__cxx11::string::append((char *)&local_4c0);
  std::ofstream::ofstream(local_230,(string *)&local_4c0,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"#pragma once",0xc);
  std::ios::widen((char)(ostream *)local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_230,"#define CPPJIT_EXPORT extern \"C\"",0x20);
  std::ios::widen((char)(ostream *)local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::ofstream::close();
  if ((this->super_builder).verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compile_cmd: ",0xd);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_480,local_478);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  iVar2 = system((char *)local_480);
  if ((this->super_builder).verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compile log:",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    std::operator+(&local_4c0,local_2d8,local_2e0);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_4c0);
    psVar11 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250.field_2._8_8_ = plVar3[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_250._M_string_length = plVar3[1];
    *plVar3 = (long)psVar11;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    builder::read_and_print_log(&this->super_builder,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != paVar10) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
  }
  if (iVar2 == 0) {
    lVar6 = std::chrono::_V2::system_clock::now();
    if ((this->super_builder).verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"compile duration: ",0x12);
      poVar4 = std::ostream::_M_insert<double>((double)(lVar6 - lVar5) / 1000000000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    pcVar1 = (this->linker)._M_dataplus._M_p;
    local_290[0] = local_280;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_290,pcVar1,pcVar1 + (this->linker)._M_string_length);
    std::__cxx11::string::append((char *)local_290);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_290,(ulong)(this->link_flags)._M_dataplus._M_p);
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_450 = *plVar9;
      lStack_448 = plVar3[3];
      local_460 = &local_450;
    }
    else {
      local_450 = *plVar9;
      local_460 = (long *)*plVar3;
    }
    local_458 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_460);
    local_440 = &local_430;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_430 = *plVar9;
      lStack_428 = plVar3[3];
    }
    else {
      local_430 = *plVar9;
      local_440 = (long *)*plVar3;
    }
    local_438 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_2d0);
    local_420 = &local_410;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_410 = *plVar9;
      lStack_408 = plVar3[3];
    }
    else {
      local_410 = *plVar9;
      local_420 = (long *)*plVar3;
    }
    local_418 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_420);
    local_400 = &local_3f0;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_3f0 = *plVar9;
      lStack_3e8 = plVar3[3];
    }
    else {
      local_3f0 = *plVar9;
      local_400 = (long *)*plVar3;
    }
    local_3f8 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_300);
    local_3e0 = &local_3d0;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_3d0 = *plVar9;
      lStack_3c8 = plVar3[3];
    }
    else {
      local_3d0 = *plVar9;
      local_3e0 = (long *)*plVar3;
    }
    local_3d8 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_3e0);
    local_3c0 = &local_3b0;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_3b0 = *plVar9;
      lStack_3a8 = plVar3[3];
    }
    else {
      local_3b0 = *plVar9;
      local_3c0 = (long *)*plVar3;
    }
    local_3b8 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_3c0,(ulong)(this->library_paths)._M_dataplus._M_p);
    local_3a0 = &local_390;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_390 = *plVar9;
      lStack_388 = plVar3[3];
    }
    else {
      local_390 = *plVar9;
      local_3a0 = (long *)*plVar3;
    }
    local_398 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_3a0);
    local_380 = &local_370;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_370 = *plVar9;
      lStack_368 = plVar3[3];
    }
    else {
      local_370 = *plVar9;
      local_380 = (long *)*plVar3;
    }
    local_378 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_380,(ulong)(this->libraries)._M_dataplus._M_p);
    local_360 = &local_350;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_350 = *plVar9;
      lStack_348 = plVar3[3];
    }
    else {
      local_350 = *plVar9;
      local_360 = (long *)*plVar3;
    }
    local_358 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_360);
    local_340 = &local_330;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_330 = *plVar9;
      lStack_328 = plVar3[3];
    }
    else {
      local_330 = *plVar9;
      local_340 = (long *)*plVar3;
    }
    local_338 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_340,
                                (ulong)(this->super_builder).compile_dir._M_dataplus._M_p);
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_310 = *plVar9;
      lStack_308 = plVar3[3];
      local_320 = &local_310;
    }
    else {
      local_310 = *plVar9;
      local_320 = (long *)*plVar3;
    }
    local_318 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_320,
                                (ulong)(this->super_builder).kernel_name._M_dataplus._M_p);
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    psVar11 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_4a0.field_2._M_allocated_capacity = *psVar11;
      local_4a0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar11;
      local_4a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_4a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar11;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_4a0);
    psVar11 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_4c0.field_2._M_allocated_capacity = *psVar11;
      local_4c0.field_2._8_8_ = plVar3[3];
      local_4c0._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_4c0.field_2._M_allocated_capacity = *psVar11;
      local_4c0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_4c0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar11;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if (local_320 != &local_310) {
      operator_delete(local_320,local_310 + 1);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340,local_330 + 1);
    }
    if (local_360 != &local_350) {
      operator_delete(local_360,local_350 + 1);
    }
    if (local_380 != &local_370) {
      operator_delete(local_380,local_370 + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390 + 1);
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,local_3b0 + 1);
    }
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0,local_3d0 + 1);
    }
    if (local_400 != &local_3f0) {
      operator_delete(local_400,local_3f0 + 1);
    }
    if (local_420 != &local_410) {
      operator_delete(local_420,local_410 + 1);
    }
    if (local_440 != &local_430) {
      operator_delete(local_440,local_430 + 1);
    }
    if (local_460 != &local_450) {
      operator_delete(local_460,local_450 + 1);
    }
    if (local_290[0] != local_280) {
      operator_delete(local_290[0],local_280[0] + 1);
    }
    if ((this->super_builder).verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"link_cmd: ",10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4c0._M_dataplus._M_p,
                          local_4c0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    iVar2 = system(local_4c0._M_dataplus._M_p);
    if ((this->super_builder).verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"link log:",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      std::operator+(&local_4a0,local_2d8,local_2e0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_4a0);
      psVar11 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_270.field_2._M_allocated_capacity = *psVar11;
        local_270.field_2._8_8_ = plVar3[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar11;
        local_270._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_270._M_string_length = plVar3[1];
      *plVar3 = (long)psVar11;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      builder::read_and_print_log(&this->super_builder,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
    }
    if (iVar2 == 0) {
      lVar6 = std::chrono::_V2::system_clock::now();
      if ((this->super_builder).verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"link duration: ",0xf);
        poVar4 = std::ostream::_M_insert<double>((double)(lVar6 - lVar5) / 1000000000.0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      pvVar7 = builder::load_kernel(&this->super_builder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != paVar10) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if (local_480 != &local_470) {
        operator_delete(local_480,local_470 + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      return pvVar7;
    }
    pcVar8 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4a0,"error: compile of kernel failed","");
    cppjit_exception::cppjit_exception(pcVar8,&local_4a0);
    __cxa_throw(pcVar8,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  pcVar8 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  local_4c0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c0,"error: compilation of kernel failed","");
  cppjit_exception::cppjit_exception(pcVar8,&local_4c0);
  __cxa_throw(pcVar8,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void *compile_impl() override {
    // std::string kernel_source_dir = kernel_compile_dir;
    std::string source_file(source_dir + kernel_name + ".cpp");
    std::string object_file(compile_dir + kernel_name + ".o");
    std::string library_file(compile_dir + "lib" + kernel_name + ".so");
    // add compile dir as special include path for dynamically generated headers
    std::string compile_cmd(compiler + " -o " + object_file + " -c " +
                            cpp_flags + " " + include_paths + " -I" +
                            compile_dir + " " + source_file + " " +
                            " > " +
                            compile_dir + kernel_name + "_compile.log 2>&1");

    if (verbose) {
      std::cout << "creating per-kernel header" << std::endl;
    }

    std::ofstream kernel_header_file(compile_dir + "cppjit_kernel.hpp");
    kernel_header_file << "#pragma once" << std::endl;
    kernel_header_file << "#define CPPJIT_EXPORT extern \"C\"" << std::endl;
    kernel_header_file.close();

    if (verbose) {
      std::cout << "compile_cmd: " << compile_cmd << std::endl;
    }
    std::chrono::high_resolution_clock::time_point compile_start =
        std::chrono::high_resolution_clock::now();
    int return_value = std::system(compile_cmd.c_str());
    if (verbose) {
      std::cout << "compile log:" << std::endl;
      read_and_print_log(compile_dir + kernel_name + "_compile.log");
    }
    if (return_value != 0) {
      throw cppjit_exception("error: compilation of kernel failed");
    }

    std::chrono::high_resolution_clock::time_point compile_end =
        std::chrono::high_resolution_clock::now();
    double compile_duration =
        std::chrono::duration<double>(compile_end - compile_start).count();
    if (verbose) {
      std::cout << "compile duration: " << compile_duration << std::endl;
    }

    std::string link_cmd(linker + " " + link_flags + " -o " + library_file +
                         " " + object_file + " " + library_paths + " " + libraries + " > " + compile_dir + kernel_name +
                         "_link.log 2>&1");
    if (verbose) {
      std::cout << "link_cmd: " << link_cmd << std::endl;
    }
    std::chrono::high_resolution_clock::time_point link_start =
        std::chrono::high_resolution_clock::now();
    return_value = std::system(link_cmd.c_str());
    if (verbose) {
      std::cout << "link log:" << std::endl;
      read_and_print_log(compile_dir + kernel_name + "_link.log");
    }
    if (return_value != 0) {
      throw cppjit_exception("error: compile of kernel failed");
    }
    std::chrono::high_resolution_clock::time_point link_end =
        std::chrono::high_resolution_clock::now();
    double link_duration =
        std::chrono::duration<double>(link_end - link_start).count();
    if (verbose) {
      std::cout << "link duration: " << link_duration << std::endl;
    }
    return this->load_kernel();
  }